

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver,Options *options)

{
  float value;
  double value_00;
  size_t sVar1;
  java *this_00;
  bool bVar2;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *pEVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *this_01;
  string_view text;
  string_view src;
  string_view format;
  string_view src_00;
  string_view src_01;
  string_view format_00;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string local_48;
  
  uVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) - 1;
  if (9 < uVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
               ,0x21a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d8,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  src._M_str = (char *)((long)&switchD_00172bb0::switchdataD_00461f70 +
                       (long)(int)(&switchD_00172bb0::switchdataD_00461f70)[uVar4]);
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  default:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,*(int *)(this + 0x50));
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_d8,a);
    return __return_storage_ptr__;
  case 2:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,*(long *)(this + 0x50));
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView("L");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_a8);
    return __return_storage_ptr__;
  case 4:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,*(long *)(this + 0x50));
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_a8,(lts_20250127 *)&local_d8,a_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                   "L");
    goto LAB_00172cbc;
  case 5:
    value_00 = *(double *)(this + 0x50);
    if (INFINITY <= value_00) {
      src._M_str = "Double.POSITIVE_INFINITY";
      goto LAB_00172d77;
    }
    if (value_00 <= -INFINITY) {
      src._M_str = "Double.NEGATIVE_INFINITY";
      goto LAB_00172d77;
    }
    if (NAN(value_00)) {
      src._M_str = "Double.NaN";
      goto LAB_00172d77;
    }
    io::SimpleDtoa_abi_cxx11_((string *)&local_78,(io *)this,value_00);
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView("D");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_a8);
    break;
  case 6:
    value = *(float *)(this + 0x50);
    if (INFINITY <= value) {
      src._M_str = "Float.POSITIVE_INFINITY";
      goto LAB_00172d77;
    }
    if (value <= -INFINITY) {
      src._M_str = "Float.NEGATIVE_INFINITY";
      goto LAB_00172d77;
    }
    if (NAN(value)) {
      src._M_str = "Float.NaN";
      goto LAB_00172d77;
    }
    io::SimpleFtoa_abi_cxx11_((string *)&local_78,(io *)this,value);
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView("F");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_a8);
    break;
  case 7:
    src._M_str = "false";
    if (this[0x50] != (java)0x0) {
      src._M_str = "true";
    }
LAB_00172d77:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,src._M_str,(allocator<char> *)&local_d8);
    return __return_storage_ptr__;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_48,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),descriptor_00
               ,SUB81(field,0));
    local_d8.piece_._M_str = local_48._M_dataplus._M_p;
    local_d8.piece_._M_len = local_48._M_string_length;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView(".");
    pEVar3 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    local_78.piece_._M_str = (pEVar3->all_names_->_M_dataplus)._M_p;
    local_78.piece_._M_len = pEVar3->all_names_->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_78,
               (AlphaNum *)name_resolver);
LAB_00172e5f:
    this_01 = (AlphaNum *)&local_48;
    goto LAB_00172e67;
  case 9:
    if (this[2] == (java)0xc) {
      if (((byte)this[1] & 1) == 0) {
        src._M_str = "com.google.protobuf.ByteString.EMPTY";
        goto LAB_00172d77;
      }
      src._M_len = **(size_t **)(this + 0x50);
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)&local_a8,(lts_20250127 *)(*(size_t **)(this + 0x50))[1],src);
      local_d8.piece_._M_str = (char *)local_a8.piece_._M_len;
      local_d8.piece_._M_len = (size_t)local_a8.piece_._M_str;
      format._M_str = (char *)&local_d8;
      format._M_len = (size_t)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")";
      absl::lts_20250127::Substitute_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)0x34,format,(Arg *)name_resolver);
    }
    else {
      sVar1 = **(size_t **)(this + 0x50);
      this_00 = (java *)(*(size_t **)(this + 0x50))[1];
      text._M_str = (char *)&switchD_00172bb0::switchdataD_00461f70;
      text._M_len = sVar1;
      bVar2 = AllAscii(this_00,text);
      if (bVar2) {
        local_d8.piece_ = absl::lts_20250127::NullSafeStringView("\"");
        src_00._M_str = src._M_str;
        src_00._M_len = **(size_t **)(this + 0x50);
        absl::lts_20250127::CEscape_abi_cxx11_
                  (&local_48,(lts_20250127 *)(*(size_t **)(this + 0x50))[1],src_00);
        local_a8.piece_._M_str = local_48._M_dataplus._M_p;
        local_a8.piece_._M_len = local_48._M_string_length;
        local_78.piece_ = absl::lts_20250127::NullSafeStringView("\"");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_78,
                   (AlphaNum *)name_resolver);
        goto LAB_00172e5f;
      }
      src_01._M_str = src._M_str;
      src_01._M_len = sVar1;
      absl::lts_20250127::CEscape_abi_cxx11_((string *)&local_a8,(lts_20250127 *)this_00,src_01);
      local_d8.piece_._M_str = (char *)local_a8.piece_._M_len;
      local_d8.piece_._M_len = (size_t)local_a8.piece_._M_str;
      format_00._M_str = (char *)&local_d8;
      format_00._M_len = (size_t)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")";
      absl::lts_20250127::Substitute_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)0x35,format_00,(Arg *)name_resolver);
    }
LAB_00172cbc:
    this_01 = &local_a8;
    goto LAB_00172e67;
  case 10:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_78,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView(".getDefaultInstance()");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_a8,&local_a8);
  }
  this_01 = &local_78;
LAB_00172e67:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver, Options options) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return absl::StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(field->default_value_int64(), "L");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return absl::StrCat(io::SimpleDtoa(value), "D");
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return absl::StrCat(io::SimpleFtoa(value), "F");
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return absl::StrCat(
              "\"", absl::CEscape(field->default_value_string()), "\"");
        } else {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return absl::StrCat(
          name_resolver->GetClassName(field->enum_type(), immutable), ".",
          field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return absl::StrCat(
          name_resolver->GetClassName(field->message_type(), immutable),
          ".getDefaultInstance()");

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}